

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_valid_point(uECC_word_t *point,uECC_Curve curve)

{
  char num_words_00;
  cmpresult_t cVar1;
  uECC_word_t uVar2;
  wordcount_t num_words;
  uECC_word_t tmp2 [4];
  uECC_word_t tmp1 [4];
  uECC_Curve curve_local;
  uECC_word_t *point_local;
  
  num_words_00 = curve->num_words;
  uVar2 = uECC_vli_isZero(point,curve->num_words << 1);
  if (((uVar2 == 0) && (cVar1 = uECC_vli_cmp_unsafe(curve->p,point,num_words_00), cVar1 == '\x01'))
     && (cVar1 = uECC_vli_cmp_unsafe(curve->p,point + (int)num_words_00,num_words_00),
        cVar1 == '\x01')) {
    uECC_vli_modSquare_fast(tmp2 + 3,point + (int)num_words_00,curve);
    (*curve->x_side)((uECC_word_t *)&stack0xffffffffffffff98,point,curve);
    uVar2 = uECC_vli_equal(tmp2 + 3,(uECC_word_t *)&stack0xffffffffffffff98,num_words_00);
    return (int)uVar2;
  }
  return 0;
}

Assistant:

int uECC_valid_point(const uECC_word_t *point, uECC_Curve curve) {
    uECC_word_t tmp1[uECC_MAX_WORDS];
    uECC_word_t tmp2[uECC_MAX_WORDS];
    wordcount_t num_words = curve->num_words;

    /* The point at infinity is invalid. */
    if (EccPoint_isZero(point, curve)) {
        return 0;
    }

    /* x and y must be smaller than p. */
    if (uECC_vli_cmp_unsafe(curve->p, point, num_words) != 1 ||
            uECC_vli_cmp_unsafe(curve->p, point + num_words, num_words) != 1) {
        return 0;
    }

    uECC_vli_modSquare_fast(tmp1, point + num_words, curve);
    curve->x_side(tmp2, point, curve); /* tmp2 = x^3 + ax + b */

    /* Make sure that y^2 == x^3 + ax + b */
    return (int)(uECC_vli_equal(tmp1, tmp2, num_words));
}